

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_unary_expression
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_unary_expression_t *expr)

{
  instruction_t iVar1;
  typed_expression_t *ptVar2;
  ulong local_18;
  
  ptVar2 = typed_unary_expression_t::operand(expr);
  (**(code **)(*(long *)ptVar2 + 0x30))(ptVar2,this);
  iVar1 = operator_to_instruction(this,(expr->super_unary_expression_t)._operator);
  local_18 = (ulong)iVar1;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict2 *)&local_18);
  return;
}

Assistant:

void compile_unary_expression(tchecker::typed_unary_expression_t const & expr)
  {
    expr.operand().visit(*this);
    _bytecode_back_inserter = operator_to_instruction(expr.unary_operator());
  }